

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

void filemgr_set_compaction_state(filemgr *old_file,filemgr *new_file,file_status_t status)

{
  undefined8 *in_RSI;
  filemgr *in_RDI;
  char *new_filename;
  filemgr *file;
  
  if (in_RDI != (filemgr *)0x0) {
    pthread_spin_lock(&in_RDI->lock);
    if (in_RSI == (undefined8 *)0x0) {
      new_filename = (char *)0x0;
    }
    else {
      new_filename = (char *)*in_RSI;
    }
    file = in_RDI;
    assign_new_filename(in_RDI,new_filename);
    atomic_store_uint8_t
              ((atomic<unsigned_char> *)file,(uint8_t)((ulong)new_filename >> 0x38),
               (memory_order)new_filename);
    pthread_spin_unlock(&in_RDI->lock);
    if (in_RSI != (undefined8 *)0x0) {
      pthread_spin_lock((pthread_spinlock_t *)(in_RSI + 0x34));
      assign_old_filename(file,new_filename);
      pthread_spin_unlock((pthread_spinlock_t *)(in_RSI + 0x34));
    }
  }
  return;
}

Assistant:

void filemgr_set_compaction_state(struct filemgr *old_file,
                                  struct filemgr *new_file,
                                  file_status_t status)
{
    if (old_file) {
        spin_lock(&old_file->lock);
        assign_new_filename(old_file, new_file ? new_file->filename : NULL);
        atomic_store_uint8_t(&old_file->status, status);
        spin_unlock(&old_file->lock);

        if (new_file) {
            spin_lock(&new_file->lock);
            assign_old_filename(new_file, old_file->filename);
            spin_unlock(&new_file->lock);
        }
    }
}